

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  Arena *this_00;
  Extension *pEVar1;
  void *ptr;
  anon_union_8_9_fdc4a54a_for_Extension_0 this_01;
  undefined8 extraout_RAX;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar2;
  Arena *local_40 [2];
  
  pVar2 = Insert(this,number);
  pEVar1 = pVar2.first;
  pEVar1->descriptor = descriptor;
  if (((undefined1  [16])pVar2 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar1->is_repeated == false) goto LAB_00282868;
    if (0xed < (byte)(pEVar1->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4) != 8) {
        AddEnum();
LAB_002828ac:
        AddEnum();
        operator_delete(this,0x10);
        _Unwind_Resume(extraout_RAX);
      }
      if (pEVar1->is_packed != packed) goto LAB_002828ac;
      this_01 = pEVar1->field_0;
      goto LAB_00282845;
    }
LAB_0028287c:
    AddEnum((ExtensionSet *)local_40);
LAB_00282886:
    this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)operator_new(0x10);
    RepeatedField<int>::RepeatedField((RepeatedField<int> *)this_01,(Arena *)0x0);
  }
  else {
    pEVar1->type = type;
    if ((byte)(type - 0x13) < 0xee) {
      AddEnum((ExtensionSet *)local_40);
LAB_00282868:
      AddEnum((ExtensionSet *)local_40);
LAB_00282872:
      AddEnum();
      goto LAB_0028287c;
    }
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)type * 4) != 8) goto LAB_00282872;
    pEVar1->is_repeated = true;
    pEVar1->field_0xa = pEVar1->field_0xa | 1;
    pEVar1->is_packed = packed;
    this_00 = this->arena_;
    if (this_00 == (Arena *)0x0) goto LAB_00282886;
    ptr = Arena::Allocate(this_00,0x10);
    local_40[0] = this_00;
    this_01 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
              Construct<google::protobuf::Arena*>(ptr,local_40);
  }
  pEVar1->field_0 = this_01;
LAB_00282845:
  RepeatedField<int>::Add((RepeatedField<int> *)this_01,value);
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type, bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    ABSL_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->is_packed = packed;
    extension->ptr.repeated_enum_value =
        Arena::Create<RepeatedField<int>>(arena_);
  } else {
    ABSL_DCHECK_TYPE(*extension, REPEATED_FIELD, ENUM);
    ABSL_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->ptr.repeated_enum_value->Add(value);
}